

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Client_readArrayDimensionsAttribute
          (UA_Client *client,UA_NodeId nodeId,UA_UInt32 **outArrayDimensions,
          size_t *outArrayDimensionsSize)

{
  UA_Boolean UVar1;
  long lVar2;
  UA_DiagnosticInfo **ppUVar3;
  undefined8 *puVar4;
  byte bVar5;
  UA_ReadRequest in_stack_fffffffffffffda8;
  UA_DataValue *res;
  undefined1 local_1a0 [4];
  UA_StatusCode retval;
  UA_ReadResponse response;
  UA_ReadRequest request;
  UA_ReadValueId item;
  size_t *outArrayDimensionsSize_local;
  UA_UInt32 **outArrayDimensions_local;
  UA_Client *client_local;
  
  bVar5 = 0;
  UA_ReadValueId_init((UA_ReadValueId *)&request.nodesToRead);
  request.nodesToRead = (UA_ReadValueId *)nodeId._0_8_;
  UA_ReadRequest_init((UA_ReadRequest *)&response.diagnosticInfos);
  request.nodesToReadSize = (size_t)&request.nodesToRead;
  request.timestampsToReturn = UA_TIMESTAMPSTORETURN_SERVER;
  request._124_4_ = 0;
  ppUVar3 = &response.diagnosticInfos;
  puVar4 = (undefined8 *)&stack0xfffffffffffffda8;
  for (lVar2 = 0x12; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *ppUVar3;
    ppUVar3 = ppUVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  UA_Client_Service_read((UA_ReadResponse *)local_1a0,client,in_stack_fffffffffffffda8);
  res._4_4_ = response.responseHeader.timestamp._4_4_;
  if (response.responseHeader.timestamp._4_4_ == 0) {
    if (response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1) {
      res._4_4_ = *(uint *)(response.resultsSize + 0x38);
    }
    else {
      res._4_4_ = 0x80010000;
    }
  }
  if (res._4_4_ == 0) {
    if ((*(byte *)response.resultsSize >> 1 & 1) == 0) {
      if (((*(byte *)response.resultsSize & 1) == 0) ||
         (UVar1 = UA_Variant_isScalar((UA_Variant *)(response.resultsSize + 8)), UVar1)) {
        res._4_4_ = 0x80010000;
      }
    }
    else {
      res._4_4_ = (uint)(*(byte *)response.resultsSize >> 1 & 1);
    }
    if (res._4_4_ == 0) {
      UVar1 = UA_Variant_isScalar((UA_Variant *)(response.resultsSize + 8));
      if ((UVar1) || (*(long *)(response.resultsSize + 8) != 0x1604a0)) {
        res._4_4_ = 0x80010000;
      }
      else {
        *outArrayDimensions = *(UA_UInt32 **)(response.resultsSize + 0x20);
        *outArrayDimensionsSize = *(size_t *)(response.resultsSize + 0x18);
        *(undefined8 *)(response.resultsSize + 0x20) = 0;
        *(undefined8 *)(response.resultsSize + 0x18) = 0;
      }
    }
  }
  UA_ReadResponse_deleteMembers((UA_ReadResponse *)local_1a0);
  return res._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_readArrayDimensionsAttribute(UA_Client *client, const UA_NodeId nodeId,
                                       UA_UInt32 **outArrayDimensions,
                                       size_t *outArrayDimensionsSize) {
    UA_ReadValueId item;
    UA_ReadValueId_init(&item);
    item.nodeId = nodeId;
    item.attributeId = UA_ATTRIBUTEID_ARRAYDIMENSIONS;
    UA_ReadRequest request;
    UA_ReadRequest_init(&request);
    request.nodesToRead = &item;
    request.nodesToReadSize = 1;
    UA_ReadResponse response = UA_Client_Service_read(client, request);
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD) {
        if(response.resultsSize == 1)
            retval = response.results[0].status;
        else
            retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
    }
    if(retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    UA_DataValue *res = response.results;
    if(res->hasStatus != UA_STATUSCODE_GOOD)
        retval = res->hasStatus;
    else if(!res->hasValue || UA_Variant_isScalar(&res->value))
        retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
    if(retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    if(UA_Variant_isScalar(&res->value) ||
       res->value.type != &UA_TYPES[UA_TYPES_UINT32]) {
        retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
        goto cleanup;
    }

    /* Move data out of the results structure instead of copying */
    *outArrayDimensions = res->value.data;
    *outArrayDimensionsSize = res->value.arrayLength;
    res->value.data = NULL;
    res->value.arrayLength = 0;

 cleanup:
    UA_ReadResponse_deleteMembers(&response);
    return retval;

}